

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rprog.c
# Opt level: O1

bool move_prog_door_close(ROOM_INDEX_DATA *room,CHAR_DATA *ch,int dir)

{
  long *plVar1;
  EXIT_DATA *pEVar2;
  
  pEVar2 = room->exit[dir];
  if ((pEVar2->exit_info[0] & 2) == 0) {
    act("The door to the north closes up behind you, locking with a tiny click.",ch,(void *)0x0,
        (void *)0x0,3);
    act("The door to the south closes up behind $n, locking with a tiny click.",ch,(void *)0x0,
        (void *)0x0,0);
    plVar1 = pEVar2->exit_info;
    *plVar1 = *plVar1 | 0x106;
  }
  return true;
}

Assistant:

bool move_prog_door_close(ROOM_INDEX_DATA *room, CHAR_DATA *ch, int dir)
{
	EXIT_DATA *exit = room->exit[dir];

	if (IS_SET(exit->exit_info, EX_CLOSED))
		return true;

	act("The door to the north closes up behind you, locking with a tiny click.", ch, 0, 0, TO_CHAR);
	act("The door to the south closes up behind $n, locking with a tiny click.", ch, 0, 0, TO_ROOM);
	SET_BIT(exit->exit_info, EX_CLOSED);
	SET_BIT(exit->exit_info, EX_LOCKED);
	SET_BIT(exit->exit_info, EX_NONOBVIOUS);

	return true;
}